

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,uint argument)

{
  Allocator *allocator;
  RegVmLoweredInstruction *this_00;
  VmConstant *argument_00;
  uchar rB_local;
  uchar rA_local;
  RegVmInstructionCode code_local;
  SynBase *location_local;
  ExpressionContext *ctx_local;
  RegVmLoweredBlock *this_local;
  
  this_00 = ExpressionContext::get<RegVmLoweredInstruction>(ctx);
  allocator = ctx->allocator;
  argument_00 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,argument);
  RegVmLoweredInstruction::RegVmLoweredInstruction
            (this_00,allocator,location,code,rA,rB,rC,argument_00);
  AddInstruction(this,ctx,this_00);
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, unsigned argument)
{
	AddInstruction(ctx, new (ctx.get<RegVmLoweredInstruction>()) RegVmLoweredInstruction(ctx.allocator, location, code, rA, rB, rC, CreateConstantInt(ctx.allocator, NULL, argument)));
}